

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_structural_infix_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *cclass;
  char *cclass_00;
  code *action;
  char *name;
  
  iVar5 = G->pos;
  iVar4 = G->thunkpos;
  yyDo(G,yyPush,2,0,"yyPush");
  iVar2 = yy_named_unary_expr(G);
  if (iVar2 == 0) {
    G->pos = iVar5;
    G->thunkpos = iVar4;
    return 0;
  }
  yyDo(G,yySet,-2,0,"yySet");
  iVar5 = G->pos;
  iVar4 = G->thunkpos;
  yy__(G);
  iVar2 = yymatchString(G,"..");
  if (iVar2 == 0) {
LAB_0011127b:
    G->pos = iVar5;
    G->thunkpos = iVar4;
    yy__(G);
    iVar2 = yymatchString(G,"cmp");
    if (iVar2 != 0) {
      iVar2 = G->pos;
      iVar1 = G->thunkpos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass);
      if (iVar3 == 0) {
        G->pos = iVar2;
        G->thunkpos = iVar1;
        yy__(G);
        iVar2 = yy_named_unary_expr(G);
        if (iVar2 != 0) {
          yyDo(G,yySet,-1,0,"yySet");
          iVar5 = G->begin;
          iVar4 = G->end;
          action = yy_2_structural_infix_expr;
          name = "yy_2_structural_infix_expr";
          goto LAB_00111474;
        }
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar4;
    yy__(G);
    iVar2 = yymatchString(G,"leg");
    if (iVar2 != 0) {
      iVar2 = G->pos;
      iVar1 = G->thunkpos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_00);
      if (iVar3 == 0) {
        G->pos = iVar2;
        G->thunkpos = iVar1;
        yy__(G);
        iVar2 = yy_named_unary_expr(G);
        if (iVar2 != 0) {
          yyDo(G,yySet,-1,0,"yySet");
          iVar5 = G->begin;
          iVar4 = G->end;
          action = yy_3_structural_infix_expr;
          name = "yy_3_structural_infix_expr";
          goto LAB_00111474;
        }
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar4;
    yy__(G);
    iVar2 = yymatchString(G,"<=>");
    if (iVar2 != 0) {
      yy__(G);
      iVar2 = yy_named_unary_expr(G);
      if (iVar2 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar5 = G->begin;
        iVar4 = G->end;
        action = yy_4_structural_infix_expr;
        name = "yy_4_structural_infix_expr";
        goto LAB_00111474;
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar4;
  }
  else {
    iVar2 = G->pos;
    iVar1 = G->thunkpos;
    iVar3 = yymatchChar(G,0x2e);
    if (iVar3 != 0) goto LAB_0011127b;
    G->pos = iVar2;
    G->thunkpos = iVar1;
    yy__(G);
    iVar2 = yy_named_unary_expr(G);
    if (iVar2 == 0) goto LAB_0011127b;
    yyDo(G,yySet,-1,0,"yySet");
    iVar5 = G->begin;
    iVar4 = G->end;
    action = yy_1_structural_infix_expr;
    name = "yy_1_structural_infix_expr";
LAB_00111474:
    yyDo(G,action,iVar5,iVar4,name);
  }
  yyDo(G,yy_5_structural_infix_expr,G->begin,G->end,"yy_5_structural_infix_expr");
  yyDo(G,yyPop,2,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_structural_infix_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 2, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "structural_infix_expr"));
  if (!yy_named_unary_expr(G))  goto l667;
  yyDo(G, yySet, -2, 0, "yySet");

  {  int yypos668= G->pos, yythunkpos668= G->thunkpos;
  {  int yypos670= G->pos, yythunkpos670= G->thunkpos;  if (!yy__(G))  goto l671;
  if (!yymatchString(G, "..")) goto l671;

  {  int yypos672= G->pos, yythunkpos672= G->thunkpos;  if (!yymatchChar(G, '.')) goto l672;
  goto l671;
  l672:;	  G->pos= yypos672; G->thunkpos= yythunkpos672;
  }  if (!yy__(G))  goto l671;
  if (!yy_named_unary_expr(G))  goto l671;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_structural_infix_expr, G->begin, G->end, "yy_1_structural_infix_expr");
  goto l670;
  l671:;	  G->pos= yypos670; G->thunkpos= yythunkpos670;  if (!yy__(G))  goto l673;
  if (!yymatchString(G, "cmp")) goto l673;

  {  int yypos674= G->pos, yythunkpos674= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\000\000\000\000\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-z")) goto l674;
  goto l673;
  l674:;	  G->pos= yypos674; G->thunkpos= yythunkpos674;
  }  if (!yy__(G))  goto l673;
  if (!yy_named_unary_expr(G))  goto l673;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_structural_infix_expr, G->begin, G->end, "yy_2_structural_infix_expr");
  goto l670;
  l673:;	  G->pos= yypos670; G->thunkpos= yythunkpos670;  if (!yy__(G))  goto l675;
  if (!yymatchString(G, "leg")) goto l675;

  {  int yypos676= G->pos, yythunkpos676= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\000\000\000\000\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-z")) goto l676;
  goto l675;
  l676:;	  G->pos= yypos676; G->thunkpos= yythunkpos676;
  }  if (!yy__(G))  goto l675;
  if (!yy_named_unary_expr(G))  goto l675;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_structural_infix_expr, G->begin, G->end, "yy_3_structural_infix_expr");
  goto l670;
  l675:;	  G->pos= yypos670; G->thunkpos= yythunkpos670;  if (!yy__(G))  goto l668;
  if (!yymatchString(G, "<=>")) goto l668;
  if (!yy__(G))  goto l668;
  if (!yy_named_unary_expr(G))  goto l668;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_structural_infix_expr, G->begin, G->end, "yy_4_structural_infix_expr");

  }
  l670:;	  goto l669;
  l668:;	  G->pos= yypos668; G->thunkpos= yythunkpos668;
  }
  l669:;	  yyDo(G, yy_5_structural_infix_expr, G->begin, G->end, "yy_5_structural_infix_expr");
  yyprintf((stderr, "  ok   structural_infix_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 2, 0, "yyPop");
  return 1;
  l667:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "structural_infix_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}